

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O0

void __thiscall
iu_Variant_x_iutest_x_CompareRawType_Test::Body(iu_Variant_x_iutest_x_CompareRawType_Test *this)

{
  bool bVar1;
  char *pcVar2;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_R9;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *val2;
  type **in_stack_ffffffffffffe7a8;
  AssertionHelper local_1730;
  Fixed local_1700;
  undefined1 local_1574 [12];
  AssertionResult iutest_ar_11;
  Fixed local_1518;
  char local_138c [4];
  undefined1 local_1388 [8];
  AssertionResult iutest_ar_10;
  Fixed local_1330;
  undefined1 local_11a4 [12];
  AssertionResult iutest_ar_9;
  Fixed local_1148;
  char local_fbc [4];
  undefined1 local_fb8 [8];
  AssertionResult iutest_ar_8;
  Fixed local_f60;
  undefined1 local_dd4 [12];
  AssertionResult iutest_ar_7;
  Fixed local_d78;
  char local_bec [4];
  undefined1 local_be8 [8];
  AssertionResult iutest_ar_6;
  Fixed local_b90;
  undefined1 local_a04 [12];
  AssertionResult iutest_ar_5;
  Fixed local_9a8;
  char local_81c [4];
  undefined1 local_818 [8];
  AssertionResult iutest_ar_4;
  Fixed local_7c0;
  undefined1 local_634 [12];
  AssertionResult iutest_ar_3;
  Fixed local_5d8;
  char local_44c [4];
  undefined1 local_448 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3f0;
  undefined1 local_264 [12];
  AssertionResult iutest_ar_1;
  Fixed local_208;
  char local_7c [4];
  undefined1 local_78 [8];
  AssertionResult iutest_ar;
  int local_3c;
  undefined1 local_38 [8];
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  iu_Variant_x_iutest_x_CompareRawType_Test *this_local;
  
  local_3c = 1;
  v.
  super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>._32_8_ = this;
  std::variant<int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<int,float,std::__cxx11::string> *)local_38,&local_3c);
  iutest::detail::AlwaysZero();
  local_7c[0] = '\x01';
  local_7c[1] = '\0';
  local_7c[2] = '\0';
  local_7c[3] = '\0';
  iutest::internal::backward::EqHelper<false>::
  Compare<int,std::variant<int,float,std::__cxx11::string>>
            ((AssertionResult *)local_78,(EqHelper<false> *)0x18cd4f,"v",local_7c,(int *)local_38,
             in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_78);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x7e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_208);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  iutest::detail::AlwaysZero();
  local_264._0_4_ = 1;
  iutest::internal::backward::EqHelper<false>::
  Compare<std::variant<int,float,std::__cxx11::string>,int>
            ((AssertionResult *)(local_264 + 4),(EqHelper<false> *)"v","1",local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_264,(int *)in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_264 + 4));
  if (!bVar1) {
    memset(&local_3f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)(local_264 + 4));
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x7f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)(local_264 + 4));
  iutest::detail::AlwaysZero();
  local_44c[0] = '\0';
  local_44c[1] = '\0';
  local_44c[2] = '\0';
  local_44c[3] = '\0';
  val2 = (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::backward::NeHelper<true>::
  Compare<int,std::variant<int,float,std::__cxx11::string>>
            ((AssertionResult *)local_448,(NeHelper<true> *)0x18b3b7,"v",local_44c,(int *)local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffe7a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    memset(&local_5d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_448);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x80,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  iutest::detail::AlwaysZero();
  local_634._0_4_ = 0;
  iutest::internal::backward::NeHelper<false>::
  Compare<std::variant<int,float,std::__cxx11::string>,int>
            ((AssertionResult *)(local_634 + 4),(NeHelper<false> *)"v","0",local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_634,(int *)val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_634 + 4));
  if (!bVar1) {
    memset(&local_7c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)(local_634 + 4));
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x81,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_7c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)(local_634 + 4));
  iutest::detail::AlwaysZero();
  local_81c[0] = '\x01';
  local_81c[1] = '\0';
  local_81c[2] = '\0';
  local_81c[3] = '\0';
  iutest::internal::CmpHelperLE<int,std::variant<int,float,std::__cxx11::string>>
            ((AssertionResult *)local_818,(internal *)0x18cd4f,"v",local_81c,(int *)local_38,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    memset(&local_9a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_818);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x82,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_9a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  iutest::detail::AlwaysZero();
  local_a04._0_4_ = 1;
  iutest::internal::CmpHelperLE<std::variant<int,float,std::__cxx11::string>,int>
            ((AssertionResult *)(local_a04 + 4),(internal *)"v","1",local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a04,(int *)val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_a04 + 4));
  if (!bVar1) {
    memset(&local_b90,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b90);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)(local_a04 + 4));
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x83,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_b90);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b90);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)(local_a04 + 4));
  iutest::detail::AlwaysZero();
  local_bec[0] = '\0';
  local_bec[1] = '\0';
  local_bec[2] = '\0';
  local_bec[3] = '\0';
  iutest::internal::CmpHelperLT<int,std::variant<int,float,std::__cxx11::string>>
            ((AssertionResult *)local_be8,(internal *)0x18b3b7,"v",local_bec,(int *)local_38,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    memset(&local_d78,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d78);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_be8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_7.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x84,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_7.m_result,&local_d78);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d78);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  iutest::detail::AlwaysZero();
  local_dd4._0_4_ = 2;
  iutest::internal::CmpHelperLT<std::variant<int,float,std::__cxx11::string>,int>
            ((AssertionResult *)(local_dd4 + 4),(internal *)"v","2",local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_dd4,(int *)val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_dd4 + 4));
  if (!bVar1) {
    memset(&local_f60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_f60);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)(local_dd4 + 4));
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_8.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x85,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_f60);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_f60);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)(local_dd4 + 4));
  iutest::detail::AlwaysZero();
  local_fbc[0] = '\x01';
  local_fbc[1] = '\0';
  local_fbc[2] = '\0';
  local_fbc[3] = '\0';
  iutest::internal::CmpHelperGE<int,std::variant<int,float,std::__cxx11::string>>
            ((AssertionResult *)local_fb8,(internal *)0x18cd4f,"v",local_fbc,(int *)local_38,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fb8);
  if (!bVar1) {
    memset(&local_1148,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1148);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_fb8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_9.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x86,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_9.m_result,&local_1148);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_9.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1148);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_fb8);
  iutest::detail::AlwaysZero();
  local_11a4._0_4_ = 1;
  iutest::internal::CmpHelperGE<std::variant<int,float,std::__cxx11::string>,int>
            ((AssertionResult *)(local_11a4 + 4),(internal *)"v","1",local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_11a4,(int *)val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_11a4 + 4));
  if (!bVar1) {
    memset(&local_1330,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1330);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)(local_11a4 + 4));
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_10.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x87,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_10.m_result,&local_1330);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_10.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1330);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)(local_11a4 + 4));
  iutest::detail::AlwaysZero();
  local_138c[0] = '\x02';
  local_138c[1] = '\0';
  local_138c[2] = '\0';
  local_138c[3] = '\0';
  iutest::internal::CmpHelperGT<int,std::variant<int,float,std::__cxx11::string>>
            ((AssertionResult *)local_1388,(internal *)0x18b2f8,"v",local_138c,(int *)local_38,val2)
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
  if (!bVar1) {
    memset(&local_1518,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1518);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1388);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_11.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x88,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_11.m_result,&local_1518);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_11.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1518);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
  iutest::detail::AlwaysZero();
  local_1574._0_4_ = 0;
  iutest::internal::CmpHelperGT<std::variant<int,float,std::__cxx11::string>,int>
            ((AssertionResult *)(local_1574 + 4),(internal *)"v","0",local_38,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1574,(int *)val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1574 + 4));
  if (!bVar1) {
    memset(&local_1700,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1700);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)(local_1574 + 4));
    iutest::AssertionHelper::AssertionHelper
              (&local_1730,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x89,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_1730,&local_1700);
    iutest::AssertionHelper::~AssertionHelper(&local_1730);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1700);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)(local_1574 + 4));
  std::
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  return;
}

Assistant:

IUTEST(Variant, CompareRawType)
{
    ::std::variant<int, float, ::std::string> v = 1;
    IUTEST_EXPECT_EQ(1, v);
    IUTEST_EXPECT_EQ(v, 1);
    IUTEST_EXPECT_NE(0, v);
    IUTEST_EXPECT_NE(v, 0);
    IUTEST_EXPECT_LE(1, v);
    IUTEST_EXPECT_LE(v, 1);
    IUTEST_EXPECT_LT(0, v);
    IUTEST_EXPECT_LT(v, 2);
    IUTEST_EXPECT_GE(1, v);
    IUTEST_EXPECT_GE(v, 1);
    IUTEST_EXPECT_GT(2, v);
    IUTEST_EXPECT_GT(v, 0);
}